

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta)

{
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *reduced_cost;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar1;
  bool bVar2;
  uint r_size;
  int selected;
  bool bVar3;
  row_iterator prVar4;
  longdouble *plVar5;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
  _Var6;
  rc_data *prVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  rc_data *ret_1;
  rc_data *prVar13;
  rc_data *ret;
  int iVar14;
  long lVar15;
  string_view fmt;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    bVar3 = false;
  }
  else {
    reduced_cost = this + 0x60;
    bVar3 = false;
    do {
      k = (first._M_current)->first;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)this + 0x10);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar15 = *(long *)(this + 0x50);
        prVar4 = (row_iterator)local_78._8_8_;
        do {
          lVar11 = (long)prVar4->value * 0x10;
          *(longdouble *)(lVar15 + lVar11) = *(longdouble *)(lVar15 + lVar11) * local_68;
          prVar4 = prVar4 + 1;
        } while (prVar4 != (row_iterator)local_78._0_8_);
      }
      lVar15 = (long)k;
      r_size = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                           *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      selected = -2;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar15)) {
      case 0:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11);
          prVar7 = prVar13 + 1;
          lVar11 = lVar11 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar7->value) || (NAN(prVar13->value) || NAN(prVar7->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar7,plVar1);
              prVar13 = prVar7;
            }
            prVar7 = prVar7 + 1;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar7,plVar1);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar15 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar15 * 0xc);
LAB_005c0f56:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar9,iVar10);
        break;
      case 1:
switchD_005c0b8d_caseD_1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x100),k,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size);
        break;
      case 2:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11);
          prVar7 = prVar13 + 1;
          lVar11 = lVar11 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar7->value) || (NAN(prVar13->value) || NAN(prVar7->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar7,plVar1);
              prVar13 = prVar7;
            }
            prVar7 = prVar7 + 1;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar7,plVar1);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar15 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar15 * 0xc);
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var6._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          iVar8 = 0;
          uVar12 = 0xffffffffffffffff;
          iVar14 = -2;
          do {
            selected = (int)uVar12;
            if (iVar10 < iVar8) {
              selected = iVar14;
            }
            if (iVar8 < iVar9) {
              selected = iVar14;
            }
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var6._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            uVar12 = uVar12 + 1;
            iVar8 = iVar8 + *(int *)((long)_Var6._M_t.
                                           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                           .
                                           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                                           ._M_head_impl + 0x14);
            _Var6._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
            iVar14 = selected;
          } while (r_size != uVar12);
        }
        if (selected == -2) goto LAB_005c0f56;
        break;
      case 3:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11);
          prVar7 = prVar13 + 1;
          lVar11 = lVar11 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar7->value) || (NAN(prVar13->value) || NAN(prVar7->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar7,plVar1);
              prVar13 = prVar7;
            }
            prVar7 = prVar7 + 1;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar7,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var6._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          iVar10 = 0;
          uVar12 = 0xffffffffffffffff;
          iVar9 = -2;
          do {
            selected = (int)uVar12;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar15 * 0xc) < iVar10) {
              selected = iVar9;
            }
            if (iVar10 < *(int *)(*(long *)(this + 0x70) + lVar15 * 0xc)) {
              selected = iVar9;
            }
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var6._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            uVar12 = uVar12 + 1;
            iVar10 = iVar10 + *(int *)((long)_Var6._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                                             ._M_head_impl + 0x14);
            _Var6._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
            iVar9 = selected;
          } while (r_size != uVar12);
        }
        if (selected == -2) goto switchD_005c0b8d_caseD_1;
        break;
      case 4:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar11);
          prVar7 = prVar13 + 1;
          lVar11 = lVar11 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar7->value) || (NAN(prVar13->value) || NAN(prVar7->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar7,plVar1);
              prVar13 = prVar7;
            }
            prVar7 = prVar7 + 1;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar7,plVar1);
        }
        if (-1 < (int)r_size) {
          plVar5 = *(longdouble **)(this + 0x60);
          iVar9 = 0;
          selected = -2;
          uVar12 = 0xffffffffffffffff;
          do {
            iVar10 = (int)uVar12;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar15 * 0xc) < iVar9) {
              iVar10 = selected;
            }
            if (iVar9 < *(int *)(*(long *)(this + 0x70) + lVar15 * 0xc)) {
              iVar10 = selected;
            }
            selected = iVar10;
            if ((selected != -2) && ((longdouble)0 < *plVar5)) break;
            uVar12 = uVar12 + 1;
            iVar9 = iVar9 + *(int *)((long)plVar5 + 0x14);
            plVar5 = plVar5 + 2;
          } while (r_size != uVar12);
        }
      }
      bVar2 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_78._8_8_,k,selected,r_size,local_48,local_58);
      bVar3 = (bool)(bVar3 | bVar2);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return bVar3;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);
            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            Float pi_change;
            int selected = -2;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }